

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O3

void fs_write_alotof_bufs_with_offset(int add_flags)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined8 in_RAX;
  void *__ptr;
  char *__ptr_00;
  undefined8 uVar4;
  void *unaff_RBX;
  ulong uVar5;
  long lVar6;
  char *pcVar7;
  undefined1 auVar8 [16];
  uv_buf_t uVar9;
  undefined1 auStack_42 [2];
  code *pcStack_40;
  undefined8 local_38;
  
  pcStack_40 = (code *)0x158af0;
  local_38 = in_RAX;
  unlink("test_file");
  pcStack_40 = (code *)0x158af5;
  loop = (uv_loop_t *)uv_default_loop();
  pcStack_40 = (code *)0x158b06;
  __ptr = malloc(0xd4310);
  if (__ptr == (void *)0x0) {
LAB_00158e4b:
    __ptr = unaff_RBX;
    pcStack_40 = (code *)0x158e50;
    fs_write_alotof_bufs_with_offset_cold_17();
LAB_00158e50:
    pcStack_40 = (code *)0x158e55;
    fs_write_alotof_bufs_with_offset_cold_1();
LAB_00158e55:
    pcStack_40 = (code *)0x158e5a;
    fs_write_alotof_bufs_with_offset_cold_2();
LAB_00158e5a:
    pcStack_40 = (code *)0x158e5f;
    fs_write_alotof_bufs_with_offset_cold_3();
LAB_00158e5f:
    pcStack_40 = (code *)0x158e64;
    fs_write_alotof_bufs_with_offset_cold_4();
LAB_00158e64:
    pcStack_40 = (code *)0x158e69;
    fs_write_alotof_bufs_with_offset_cold_5();
LAB_00158e69:
    pcStack_40 = (code *)0x158e6e;
    fs_write_alotof_bufs_with_offset_cold_6();
LAB_00158e6e:
    pcStack_40 = (code *)0x158e73;
    fs_write_alotof_bufs_with_offset_cold_16();
LAB_00158e73:
    pcStack_40 = (code *)0x158e78;
    fs_write_alotof_bufs_with_offset_cold_7();
LAB_00158e78:
    pcStack_40 = (code *)0x158e7d;
    fs_write_alotof_bufs_with_offset_cold_8();
LAB_00158e7d:
    pcStack_40 = (code *)0x158e82;
    fs_write_alotof_bufs_with_offset_cold_10();
LAB_00158e82:
    pcStack_40 = (code *)0x158e87;
    fs_write_alotof_bufs_with_offset_cold_11();
LAB_00158e87:
    pcStack_40 = (code *)0x158e8c;
    fs_write_alotof_bufs_with_offset_cold_12();
LAB_00158e8c:
    pcStack_40 = (code *)0x158e91;
    fs_write_alotof_bufs_with_offset_cold_13();
LAB_00158e91:
    pcStack_40 = (code *)0x158e96;
    fs_write_alotof_bufs_with_offset_cold_14();
  }
  else {
    pcStack_40 = (code *)0x158b35;
    iVar2 = uv_fs_open(0,&open_req1,"test_file",0x42,0x180,0);
    if (iVar2 < 0) goto LAB_00158e50;
    if (open_req1.result._4_4_ < 0) goto LAB_00158e55;
    pcStack_40 = (code *)0x158b57;
    uv_fs_req_cleanup(&open_req1);
    pcStack_40 = (code *)0x158b68;
    iov = (uv_buf_t)uv_buf_init("0123456789",10);
    local_38 = 0;
    pcStack_40 = (code *)0x158ba6;
    iVar2 = uv_fs_write(0,&write_req,(undefined4)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar2 != 10) goto LAB_00158e5a;
    if (write_req.result != 10) goto LAB_00158e5f;
    pcStack_40 = (code *)0x158bc9;
    uv_fs_req_cleanup(&write_req);
    lVar6 = 8;
    do {
      pcStack_40 = (code *)0x158be3;
      auVar8 = uv_buf_init(test_buf,0xd);
      *(long *)((long)__ptr + lVar6 + -8) = auVar8._0_8_;
      *(long *)((long)__ptr + lVar6) = auVar8._8_8_;
      lVar6 = lVar6 + 0x10;
    } while (lVar6 != 0xd4318);
    local_38 = 0;
    pcStack_40 = (code *)0x158c24;
    iVar2 = uv_fs_write(0,&write_req,(undefined4)open_req1.result,__ptr,0xd431,10);
    if (iVar2 < 0) goto LAB_00158e64;
    if (write_req.result != 0xac67d) goto LAB_00158e69;
    pcStack_40 = (code *)0x158c49;
    uv_fs_req_cleanup(&write_req);
    pcStack_40 = (code *)0x158c53;
    __ptr_00 = (char *)malloc(0xac67d);
    if (__ptr_00 == (char *)0x0) goto LAB_00158e6e;
    lVar6 = 8;
    pcVar7 = __ptr_00;
    do {
      pcStack_40 = (code *)0x158c75;
      auVar8 = uv_buf_init(pcVar7,0xd);
      *(long *)((long)__ptr + lVar6 + -8) = auVar8._0_8_;
      *(long *)((long)__ptr + lVar6) = auVar8._8_8_;
      lVar6 = lVar6 + 0x10;
      pcVar7 = pcVar7 + 0xd;
    } while (lVar6 != 0xd4318);
    local_38 = 0;
    pcStack_40 = (code *)0x158cba;
    iVar2 = uv_fs_read(0,&read_req,(undefined4)open_req1.result,__ptr,0xd431,10);
    if (iVar2 < 0) goto LAB_00158e73;
    lVar6 = 0xd;
    if (iVar2 != 0xd) {
      lVar6 = 0x3400;
    }
    if (read_req.result != lVar6) goto LAB_00158e78;
    pcVar7 = __ptr_00;
    uVar5 = 0;
    do {
      pcStack_40 = (code *)0x158cff;
      iVar3 = strncmp(pcVar7,test_buf,0xd);
      if (iVar3 != 0) {
        pcStack_40 = (code *)0x158e4b;
        fs_write_alotof_bufs_with_offset_cold_9();
        unaff_RBX = __ptr;
        goto LAB_00158e4b;
      }
      if (iVar2 == 0xd) break;
      pcVar7 = pcVar7 + 0xd;
      bVar1 = uVar5 < 0x3ff;
      uVar5 = uVar5 + 1;
    } while (bVar1);
    pcStack_40 = (code *)0x158d2c;
    uv_fs_req_cleanup(&read_req);
    pcStack_40 = (code *)0x158d34;
    free(__ptr_00);
    pcStack_40 = (code *)0x158d4b;
    iVar2 = uv_fs_stat(0,&stat_req,"test_file",0);
    if (iVar2 != 0) goto LAB_00158e7d;
    if (*(long *)((long)stat_req.ptr + 0x38) != write_req.result + 10) goto LAB_00158e82;
    pcStack_40 = (code *)0x158d7b;
    uv_fs_req_cleanup(&stat_req);
    pcStack_40 = (code *)0x158d8c;
    uVar9 = (uv_buf_t)uv_buf_init(buf,0x20);
    local_38 = 0;
    pcStack_40 = (code *)0x158dce;
    iov = uVar9;
    iVar2 = uv_fs_read(0,&read_req,(undefined4)open_req1.result,&iov,1,write_req.result + 10);
    if (iVar2 != 0) goto LAB_00158e87;
    if (read_req.result != 0) goto LAB_00158e8c;
    pcStack_40 = (code *)0x158df0;
    uv_fs_req_cleanup(&read_req);
    pcStack_40 = (code *)0x158e06;
    iVar2 = uv_fs_close(0,&close_req,(undefined4)open_req1.result,0);
    if (iVar2 != 0) goto LAB_00158e91;
    if (close_req.result == 0) {
      pcStack_40 = (code *)0x158e24;
      uv_fs_req_cleanup(&close_req);
      pcStack_40 = (code *)0x158e30;
      unlink("test_file");
      free(__ptr);
      return;
    }
  }
  pcStack_40 = run_test_fs_read_dir;
  fs_write_alotof_bufs_with_offset_cold_15();
  pcStack_40 = (code *)__ptr;
  loop = (uv_loop_t *)uv_default_loop();
  rmdir("test_dir");
  iVar2 = uv_fs_mkdir(loop,&mkdir_req,"test_dir",0x1ed,mkdir_cb);
  if (iVar2 == 0) {
    uv_run(loop,0);
    if (mkdir_cb_count != 1) goto LAB_0015900d;
    iVar2 = uv_fs_open(loop,&open_req1,"test_dir",0x10000,0x180,0);
    if (iVar2 < 0) goto LAB_00159012;
    uv_fs_req_cleanup(&open_req1);
    uVar9 = (uv_buf_t)uv_buf_init(auStack_42,2);
    iov = uVar9;
    iVar2 = uv_fs_read(0,&read_req,(undefined4)open_req1.result,&iov,1,0,0);
    if (iVar2 != -0x15) goto LAB_00159017;
    uv_fs_req_cleanup(&read_req);
    iVar2 = uv_fs_close(0,&close_req,(undefined4)open_req1.result,0);
    if (iVar2 == 0) {
      uv_fs_req_cleanup(&close_req);
      rmdir("test_dir");
      uVar4 = uv_default_loop();
      uv_walk(uVar4,close_walk_cb,0);
      uv_run(uVar4,0);
      uVar4 = uv_default_loop();
      iVar2 = uv_loop_close(uVar4);
      if (iVar2 == 0) {
        return;
      }
      goto LAB_00159021;
    }
  }
  else {
    run_test_fs_read_dir_cold_1();
LAB_0015900d:
    run_test_fs_read_dir_cold_2();
LAB_00159012:
    run_test_fs_read_dir_cold_3();
LAB_00159017:
    run_test_fs_read_dir_cold_4();
  }
  run_test_fs_read_dir_cold_5();
LAB_00159021:
  run_test_fs_read_dir_cold_6();
  test_fs_partial(1);
  return;
}

Assistant:

static void fs_write_alotof_bufs_with_offset(int add_flags) {
  size_t iovcount;
  size_t iovmax;
  uv_buf_t* iovs;
  char* buffer;
  size_t index;
  int r;
  int64_t offset;
  char* filler;
  int filler_len;

  filler = "0123456789";
  filler_len = strlen(filler);
  iovcount = 54321;

  /* Setup. */
  unlink("test_file");

  loop = uv_default_loop();

  iovs = malloc(sizeof(*iovs) * iovcount);
  ASSERT(iovs != NULL);
  iovmax = uv_test_getiovmax();

  r = uv_fs_open(NULL,
                 &open_req1,
                 "test_file",
                 O_RDWR | O_CREAT | add_flags,
                 S_IWUSR | S_IRUSR,
                 NULL);
  ASSERT(r >= 0);
  ASSERT(open_req1.result >= 0);
  uv_fs_req_cleanup(&open_req1);

  iov = uv_buf_init(filler, filler_len);
  r = uv_fs_write(NULL, &write_req, open_req1.result, &iov, 1, -1, NULL);
  ASSERT(r == filler_len);
  ASSERT(write_req.result == filler_len);
  uv_fs_req_cleanup(&write_req);
  offset = (int64_t)r;

  for (index = 0; index < iovcount; ++index)
    iovs[index] = uv_buf_init(test_buf, sizeof(test_buf));

  r = uv_fs_write(NULL,
                  &write_req,
                  open_req1.result,
                  iovs,
                  iovcount,
                  offset,
                  NULL);
  ASSERT(r >= 0);
  ASSERT((size_t)write_req.result == sizeof(test_buf) * iovcount);
  uv_fs_req_cleanup(&write_req);

  /* Read the strings back to separate buffers. */
  buffer = malloc(sizeof(test_buf) * iovcount);
  ASSERT(buffer != NULL);

  for (index = 0; index < iovcount; ++index)
    iovs[index] = uv_buf_init(buffer + index * sizeof(test_buf),
                              sizeof(test_buf));

  r = uv_fs_read(NULL, &read_req, open_req1.result,
                 iovs, iovcount, offset, NULL);
  ASSERT(r >= 0);
  if (r == sizeof(test_buf))
    iovcount = 1; /* Infer that preadv is not available. */
  else if (iovcount > iovmax)
    iovcount = iovmax;
  ASSERT((size_t)read_req.result == sizeof(test_buf) * iovcount);

  for (index = 0; index < iovcount; ++index)
    ASSERT(strncmp(buffer + index * sizeof(test_buf),
                   test_buf,
                   sizeof(test_buf)) == 0);

  uv_fs_req_cleanup(&read_req);
  free(buffer);

  r = uv_fs_stat(NULL, &stat_req, "test_file", NULL);
  ASSERT(r == 0);
  ASSERT((int64_t)((uv_stat_t*)stat_req.ptr)->st_size ==
         offset + (int64_t)write_req.result);
  uv_fs_req_cleanup(&stat_req);

  iov = uv_buf_init(buf, sizeof(buf));
  r = uv_fs_read(NULL,
                 &read_req,
                 open_req1.result,
                 &iov,
                 1,
                 offset + write_req.result,
                 NULL);
  ASSERT(r == 0);
  ASSERT(read_req.result == 0);
  uv_fs_req_cleanup(&read_req);

  r = uv_fs_close(NULL, &close_req, open_req1.result, NULL);
  ASSERT(r == 0);
  ASSERT(close_req.result == 0);
  uv_fs_req_cleanup(&close_req);

  /* Cleanup */
  unlink("test_file");
  free(iovs);
}